

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

bool jpge::compress_image_to_jpeg_file
               (char *pFilename,int width,int height,int num_channels,uint8 *pImage_data,
               params *comp_params)

{
  bool bVar1;
  int iVar2;
  undefined1 uVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  jpeg_encoder dst_image;
  cfile_stream local_3508;
  ulong local_34f0;
  jpeg_encoder local_34e8;
  
  local_3508.super_output_stream._vptr_output_stream = (_func_int **)&PTR__cfile_stream_001d2780;
  local_3508.m_pFile = (FILE *)0x0;
  local_3508.m_bStatus = false;
  iVar2 = cfile_stream::open(&local_3508,pFilename,height);
  if ((char)iVar2 == '\0') {
    uVar3 = 0;
  }
  else {
    jpeg_encoder::jpeg_encoder(&local_34e8);
    iVar2 = jpeg_encoder::init(&local_34e8,(EVP_PKEY_CTX *)&local_3508);
    if ((char)iVar2 == '\0') {
LAB_00157cfd:
      uVar3 = 0;
    }
    else {
      local_34f0 = (ulong)(uint)height;
      bVar4 = 1;
      do {
        if (0 < height) {
          iVar2 = 0;
          uVar6 = local_34f0;
          do {
            bVar1 = jpeg_encoder::process_scanline(&local_34e8,pImage_data + iVar2);
            if (!bVar1) {
              uVar3 = 0;
              goto LAB_00157d07;
            }
            iVar2 = iVar2 + num_channels * width;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        if ((byte)(local_34e8.m_pass_num - 3) < 0xfe) goto LAB_00157cfd;
        if (local_34e8.m_all_stream_writes_succeeded == true) {
          jpeg_encoder::process_end_of_image(&local_34e8);
        }
        if ((local_34e8.m_all_stream_writes_succeeded & 1U) == 0) goto LAB_00157cfd;
        bVar5 = bVar4 & local_34e8.m_params.m_two_pass_flag;
        bVar4 = 0;
      } while (bVar5 == 1);
      free(local_34e8.m_mcu_lines[0]);
      local_34e8.m_mcu_lines[0] = (uint8 *)0x0;
      local_34e8.m_pass_num = '\0';
      local_34e8.m_all_stream_writes_succeeded = true;
      uVar3 = local_3508.m_bStatus;
      if ((FILE *)local_3508.m_pFile != (FILE *)0x0) {
        iVar2 = fclose((FILE *)local_3508.m_pFile);
        if (iVar2 == -1) {
          local_3508.m_bStatus = false;
        }
        local_3508.m_pFile = (FILE *)0x0;
        uVar3 = local_3508.m_bStatus;
      }
    }
LAB_00157d07:
    jpeg_encoder::~jpeg_encoder(&local_34e8);
  }
  local_3508.super_output_stream._vptr_output_stream = (_func_int **)&PTR__cfile_stream_001d2780;
  if ((FILE *)local_3508.m_pFile != (FILE *)0x0) {
    fclose((FILE *)local_3508.m_pFile);
  }
  return (bool)uVar3;
}

Assistant:

bool compress_image_to_jpeg_file(const char* pFilename, int width, int height, int num_channels, const uint8* pImage_data, const params& comp_params)
	{
		cfile_stream dst_stream;
		if (!dst_stream.open(pFilename))
			return false;

		jpge::jpeg_encoder dst_image;
		if (!dst_image.init(&dst_stream, width, height, num_channels, comp_params))
			return false;

		for (uint pass_index = 0; pass_index < dst_image.get_total_passes(); pass_index++)
		{
			for (int i = 0; i < height; i++)
			{
				const uint8* pBuf = pImage_data + i * width * num_channels;
				if (!dst_image.process_scanline(pBuf))
					return false;
			}
			if (!dst_image.process_scanline(NULL))
				return false;
		}

		dst_image.deinit();

		return dst_stream.close();
	}